

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

int __thiscall Acceptor::listen(Acceptor *this,int __fd,int __n)

{
  int iVar1;
  int extraout_EAX;
  Logger *pLVar2;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pLVar2 = Logger::get_instance();
  if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","listen",0x37);
  }
  if (1 < (int)g_log_level) {
    pLVar2 = Logger::get_instance();
    Logger::write_log(pLVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp"
                      ,"listen",0x37,LOG_LEVEL_INFO,"acceptor execute listen, listen fd is %d\n",
                      this->ac_listen_fd);
    pLVar2 = Logger::get_instance();
    Logger::flush(pLVar2);
  }
  iVar1 = ::listen(this->ac_listen_fd,1000);
  if (iVar1 != -1) {
    this->ac_listening = true;
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp:61:51)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp:61:51)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    EventLoop::add_to_poller(this->ac_loop,this->ac_listen_fd,1,(EventCallback *)&local_30);
    std::_Function_base::~_Function_base((_Function_base *)&local_30);
    return extraout_EAX;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] server listen error\n","error","listen",0x39);
  }
  exit(1);
}

Assistant:

void Acceptor::listen()
{
LOG_INFO("acceptor execute listen, listen fd is %d\n", ac_listen_fd);
    if (::listen(ac_listen_fd, 1000) == -1) {
        PR_ERROR("server listen error\n");
        exit(1);
    }
    ac_listening = true;
    ac_loop->add_to_poller(ac_listen_fd, EPOLLIN, [this](){ this->do_accept(); });
}